

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall QAbstractScrollAreaPrivate::layoutChildren(QAbstractScrollAreaPrivate *this)

{
  long lVar1;
  long in_FS_OFFSET;
  bool needV;
  bool needH;
  bool *in_stack_000000e8;
  bool *in_stack_000000f0;
  QAbstractScrollAreaPrivate *in_stack_000000f8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  layoutChildren_helper(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren()
{
    bool needH = false;
    bool needV = false;
    layoutChildren_helper(&needH, &needV);
    // Call a second time if one scrollbar was needed and not the other to
    // check if it needs to readjust accordingly
    if (needH != needV)
        layoutChildren_helper(&needH, &needV);
}